

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_induct(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CHAR_DATA *pCVar5;
  char *pcVar6;
  char *pcVar7;
  CHAR_DATA *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char query [4608];
  int i;
  int cabal;
  CHAR_DATA *victim;
  char tstr [4608];
  char tbuf [4608];
  char buf [4608];
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffff9348;
  char *in_stack_ffffffffffff9350;
  char *pcVar8;
  CHAR_DATA *in_stack_ffffffffffff9358;
  char *in_stack_ffffffffffff9360;
  char *in_stack_ffffffffffff9368;
  CHAR_DATA *in_stack_ffffffffffff9370;
  char *in_stack_ffffffffffff9378;
  char **in_stack_ffffffffffff93b8;
  CHAR_DATA *in_stack_ffffffffffff93c0;
  char **in_stack_ffffffffffff93c8;
  char (*in_stack_ffffffffffff93d0) [18];
  char local_6c28 [4480];
  char *in_stack_ffffffffffffa558;
  CHAR_DATA *in_stack_ffffffffffffa560;
  int local_5a28;
  char local_5a18 [4456];
  char *in_stack_ffffffffffffb750;
  CHAR_DATA *in_stack_ffffffffffffb758;
  char *in_stack_ffffffffffffb760;
  CHAR_DATA *in_stack_ffffffffffffb768;
  CHAR_DATA *in_stack_ffffffffffffb770;
  char local_4818 [4608];
  char local_3618 [4608];
  char local_2418;
  char local_1218;
  char *local_10;
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  bVar2 = is_npc(in_stack_ffffffffffff9348);
  if (!bVar2) {
    local_10 = one_argument(in_stack_ffffffffffff9350,(char *)in_stack_ffffffffffff9348);
    local_10 = one_argument(in_stack_ffffffffffff9350,(char *)in_stack_ffffffffffff9348);
    if ((((local_8->level < 0x36) && (local_8->pcdata->induct != 5)) ||
        (bVar2 = is_npc(in_stack_ffffffffffff9348), bVar2)) ||
       ((local_8->cabal == 3 && (bVar2 = is_immortal(in_stack_ffffffffffff9348), !bVar2)))) {
      send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
    }
    else if ((local_1218 == '\0') || (local_2418 == '\0')) {
      iVar3 = get_trust(in_stack_ffffffffffff9348);
      if (iVar3 < 0x36) {
        local_3618[0] = '\0';
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
      }
      else {
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
        for (local_5a28 = 1; local_5a28 < 7; local_5a28 = local_5a28 + 1) {
          sprintf(local_4818,"%d",(ulong)(uint)(int)cabal_max[local_5a28]);
          capitalize(cabal_table[local_5a28].name);
          fmt::v9::sprintf<char[18],char*,short,char_const*,char>
                    (in_stack_ffffffffffff93d0,in_stack_ffffffffffff93c8,
                     (short *)in_stack_ffffffffffff93c0,in_stack_ffffffffffff93b8);
          std::__cxx11::string::c_str();
          send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
          std::__cxx11::string::~string((string *)&stack0xffffffffffff93b8);
        }
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
      }
    }
    else {
      pCVar5 = get_char_world(in_stack_ffffffffffffb758,in_stack_ffffffffffffb750);
      if (pCVar5 == (CHAR_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
      }
      else {
        bVar2 = is_npc(in_stack_ffffffffffff9348);
        if ((!bVar2) || (bVar2 = is_immortal(in_stack_ffffffffffff9348), bVar2)) {
          bVar2 = str_prefix(in_stack_ffffffffffff9378,(char *)in_stack_ffffffffffff9370);
          if (bVar2) {
            if (pCVar5->cabal == 0) {
              uVar4 = cabal_lookup((char *)in_stack_ffffffffffff9358);
              if (uVar4 == 0) {
                send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
              }
              else if ((uVar4 == (int)local_8->cabal) ||
                      (iVar3 = get_trust(in_stack_ffffffffffff9348), 0x35 < iVar3)) {
                if ((cabal_table[(int)uVar4].max_members < 2) ||
                   ((cabal_members[(int)uVar4] < cabal_max[(int)uVar4] ||
                    (iVar3 = get_trust(in_stack_ffffffffffff9348), 0x35 < iVar3)))) {
                  sprintf(local_3618,"%s has been inducted into the %s.",pCVar5->name,
                          cabal_table[(int)uVar4].long_name);
                  act(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358,in_stack_ffffffffffff9350,
                      in_stack_ffffffffffff9348,0);
                  strcat(local_3618,"\n\r");
                  send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
                  sprintf(local_3618,"You have been inducted into the %s.\n\r",
                          cabal_table[(int)uVar4].long_name);
                  send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
                  pCVar5->cabal = (short)uVar4;
                  pcVar8 = local_5a18;
                  pcVar6 = pCVar5->name;
                  pcVar7 = capitalize(cabal_table[(int)uVar4].name);
                  sprintf(pcVar8,"%s into %s.",pcVar6,pcVar7);
                  log_naughty(in_stack_ffffffffffff9370,in_stack_ffffffffffff9368,
                              (int)((ulong)pcVar6 >> 0x20));
                  pcVar8 = local_3618;
                  pcVar6 = capitalize(cabal_table[(int)uVar4].name);
                  sprintf(pcVar8,"AUTO: Inducted into %s by %s.\n\r",pcVar6,local_8->true_name);
                  bVar2 = is_immortal(in_stack_ffffffffffff9348);
                  if (!bVar2) {
                    add_history(in_stack_ffffffffffffb770,in_stack_ffffffffffffb768,
                                in_stack_ffffffffffffb760);
                  }
                  bVar2 = is_immortal(in_stack_ffffffffffff9348);
                  if ((bVar2) && (bVar2 = is_immortal(in_stack_ffffffffffff9348), bVar2)) {
                    pcVar8 = pCVar5->pcdata->host;
                    sprintf(local_6c28,
                            "insert into inductions(ch, victim, cabal, ctime, chsite, victimsite) values(\'%s\',\'%s\',%d,%ld,\'%s\',\'%s\')"
                            ,local_8->true_name,pCVar5->true_name,(ulong)uVar4,current_time,
                            local_8->pcdata->host);
                    one_query(pcVar8);
                  }
                  cabal_members[(int)uVar4] = cabal_members[(int)uVar4] + 1;
                  bVar2 = str_cmp(cabal_table[pCVar5->cabal].extitle,"");
                  if (bVar2) {
                    set_extitle(in_stack_ffffffffffffa560,in_stack_ffffffffffffa558);
                  }
                  pCVar5->pcdata->cabal_level = (int)cabal_table[pCVar5->cabal].start_level;
                  update_cskills(in_stack_ffffffffffff93c0);
                }
                else {
                  send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
                }
              }
              else {
                send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
              }
            }
            else {
              send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
            }
          }
          else if ((local_8->cabal == pCVar5->cabal) ||
                  (iVar3 = get_trust(in_stack_ffffffffffff9348), 0x37 < iVar3)) {
            if (pCVar5->cabal == 0) {
              send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
            }
            else {
              if (pCVar5 == local_8) {
                send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
              }
              else {
                send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
                send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
              }
              sVar1 = pCVar5->cabal;
              cabal_members[pCVar5->cabal] = cabal_members[pCVar5->cabal] + -1;
              pCVar5->cabal = 0;
              pCVar5->pcdata->cabal_level = 0;
              update_cskills(in_stack_ffffffffffff93c0);
              pcVar8 = local_3618;
              if (sVar1 == 0) {
                pcVar6 = "-";
              }
              else {
                pcVar6 = capitalize(cabal_table[(int)sVar1].name);
              }
              sprintf(pcVar8,"AUTO: Uninducted from %s by %s.\n\r",pcVar6,local_8->true_name);
              bVar2 = is_immortal(in_stack_ffffffffffff9348);
              if (!bVar2) {
                add_history(in_stack_ffffffffffffb770,in_stack_ffffffffffffb768,
                            in_stack_ffffffffffffb760);
              }
            }
          }
          else {
            send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
          }
        }
        else {
          send_to_char(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
        }
      }
    }
  }
  return;
}

Assistant:

void do_induct(CHAR_DATA *ch, char *argument)
{
	// arg1 = character, arg2 = cabal name
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH], tbuf[MAX_STRING_LENGTH];
	char tstr[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int cabal;
	int i;
	char query[MSL];

	if (is_npc(ch))
		return;

	argument = one_argument(argument, arg1); // character
	argument = one_argument(argument, arg2); // cabal name

	/**
	 *  IF the character calling induct is under level 54 and not the cabal leader,
	 *  or the character calling induct is an NPC,
	 *  or the character calling induct is in horde and is not an immortal
	 *  THEN tell them "huh?" and return.
	 */
	
	if ((ch->level < 54 && ch->pcdata->induct != CABAL_LEADER)
		|| is_npc(ch)
		|| ch->cabal == CABAL_HORDE && !is_immortal(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		if (get_trust(ch) > 53)
		{
			send_to_char("INDUCT:   Members / Max:\n\r", ch);
			send_to_char("--------------------------\n\r", ch);

			for (i = 1; i < MAX_CABAL; i++)
			{
				sprintf(tbuf, "%d", cabal_max[i]);
				auto buffer = fmt::sprintf("%-12s %-4d / %s\n\r", 
					capitalize(cabal_table[i].name), 
					cabal_members[i],
					(cabal_table[i].max_members != 1) ? tbuf : "none");
				send_to_char(buffer.c_str(), ch);
			}

			send_to_char("--------------------------\n\r", ch);
			send_to_char("Syntax: induct <char> <cabal name>\n\r", ch);
			return;
		}

		buf[0] = '\0';
		send_to_char("Syntax: induct <char> <cabal name>\n\r", ch);
		/*
		send_to_char("Valid Cabals are: ",ch);
		for (i = 1; i < (MAX_CABAL -1); i++)
		{
			sprintf(buf,"%s, ", cabal_table[i].name);
			send_to_char(buf,ch);
		}
		sprintf(buf,"%s.\n\r",cabal_table[MAX_CABAL -1].name);
		send_to_char(buf,ch);
		*/
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim) && !is_immortal(ch))
	{
		send_to_char("Mobs can't be inducted into Cabals.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "none"))
	{
		if (ch->cabal != victim->cabal && get_trust(ch) < 56)
		{
			send_to_char("You have no power over that person's affiliations!\n\r", ch);
			return;
		}
		else
		{
			if (!victim->cabal)
			{
				send_to_char("They are already not in a cabal.\n\r", ch);
				return;
			}

			if (victim != ch)
			{
				send_to_char("They have been inducted into None.\n\r", ch);
				send_to_char("You have been inducted into None.\n\r", victim);
			}
			else
			{
				send_to_char("You have been inducted into None.\n\r", victim);
			}

			cabal = victim->cabal;
			/* take away cabal skills */
			cabal_members[victim->cabal]--;
			victim->cabal = 0;
			victim->pcdata->cabal_level = 0;

			update_cskills(victim);

			sprintf(buf, "AUTO: Uninducted from %s by %s.\n\r",
				cabal ? capitalize(cabal_table[cabal].name) : "-",
				ch->true_name);

			if (!is_immortal(victim))
				add_history(nullptr, victim, buf);

			return;
		}
	}

	if (victim->cabal != 0)
	{
		send_to_char("That person is already in a cabal!\n\r", ch);
		return;
	}

	cabal = cabal_lookup(arg2);
	if (cabal == 0)
	{
		send_to_char("No such cabal exists.\n\r", ch);
		return;
	}

	if (cabal != ch->cabal && get_trust(ch) < 54)
	{
		send_to_char("You may only induct into the cabal which you belong.\n\r", ch);
		return;
	}

	if (cabal_table[cabal].max_members > 1 && cabal_max[cabal] <= cabal_members[cabal] && get_trust(ch) < 54)
	{
		// Is cabal full? If so, so solly cholly.
		send_to_char("That cabal is full.\n\r", ch);
		return;
	}

	sprintf(buf, "%s has been inducted into the %s.", victim->name, cabal_table[cabal].long_name);
	act(buf, victim, 0, ch, TO_NOTVICT);

	strcat(buf, "\n\r");
	send_to_char(buf, ch);

	sprintf(buf, "You have been inducted into the %s.\n\r", cabal_table[cabal].long_name);
	send_to_char(buf, victim);

	victim->cabal = cabal;

	sprintf(tstr, "%s into %s.", victim->name, capitalize(cabal_table[cabal].name));
	log_naughty(ch, tstr, 5);

	sprintf(buf, "AUTO: Inducted into %s by %s.\n\r", capitalize(cabal_table[cabal].name), ch->true_name);
	if (!is_immortal(victim))
		add_history(nullptr, victim, buf);

	if (is_immortal(ch) && is_immortal(victim))
	{
		sprintf(query, "insert into inductions(ch, victim, cabal, ctime, chsite, victimsite) values('%s','%s',%d,%ld,'%s','%s')",
			ch->true_name,
			victim->true_name,
			cabal,
			current_time,
			ch->pcdata->host,
			victim->pcdata->host);
		one_query(query);
	}

	cabal_members[cabal]++;

	if (str_cmp(cabal_table[victim->cabal].extitle, ""))
		set_extitle(victim, cabal_table[victim->cabal].extitle);

	victim->pcdata->cabal_level = cabal_table[victim->cabal].start_level;
	update_cskills(victim);
}